

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int removefrom_hashtable(hash_table_t *table,hash_key_t key)

{
  int iVar1;
  long in_RDI;
  int result;
  hash_key_t unaff_retaddr;
  hash_entry_t *entry;
  undefined8 *local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = lookup((hash_table_t *)entry,unaff_retaddr,
                 (hash_entry_t **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    *local_20 = 0;
    local_20[1] = 0;
    *(undefined4 *)(local_20 + 2) = 0;
    *(undefined4 *)(local_20 + 5) = 1;
    if (local_20[3] != 0) {
      *(undefined8 *)(local_20[3] + 0x20) = local_20[4];
    }
    if (local_20[4] != 0) {
      *(undefined8 *)(local_20[4] + 0x18) = local_20[3];
    }
    if (*(undefined8 **)(in_RDI + 0x28) == local_20) {
      *(undefined8 *)(in_RDI + 0x28) = local_20[3];
    }
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int removefrom_hashtable(hash_table_t *table, hash_key_t key)
{
   hash_entry_t *entry;
   int result;

   result = lookup(table, key, &entry);
   if (result == -1)
      return -1;

   entry->key = NULL;
   entry->data = NULL;
   entry->hash_value = 0;
   entry->status = TOMBSTONE;
   if (entry->next)
      entry->next->prev = entry->prev;
   if (entry->prev)
      entry->prev->next = entry->next;
   if (table->head == entry)
      table->head = entry->next;
   //Do not set entry->next to NULL, which would break the iterate & delete
   //idiom used under dlopen_wrapper.
   
   table->entry_count--;
   return 0;
}